

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

size_t check_for_leftover_values
                 (ListNode *map_head,char *error_message,size_t number_of_symbol_names)

{
  ListNode *head;
  undefined8 *result;
  ListNode *pLVar1;
  int iVar2;
  ListNode **ppLVar3;
  ListNode *pLVar4;
  size_t local_40;
  
  _assert_true((unsigned_long)map_head,"map_head",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
               ,0x39a);
  _assert_true(number_of_symbol_names,"number_of_symbol_names",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
               ,0x39b);
  local_40 = 0;
  pLVar4 = map_head;
  while (pLVar4 = pLVar4->next, pLVar4 != map_head) {
    result = (undefined8 *)pLVar4->value;
    _assert_true((unsigned_long)result,"value",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
                 ,0x3a2);
    head = (ListNode *)(result + 1);
    iVar2 = list_empty(head);
    if (iVar2 == 0) {
      if (number_of_symbol_names == 1) {
        cm_print_error(error_message,"%s");
        ppLVar3 = (ListNode **)(result + 3);
        while (pLVar1 = *ppLVar3, pLVar1 != head) {
          cm_print_error("%s:%u: note: remaining item was declared here\n",*pLVar1->value,
                         (ulong)*(uint *)((long)pLVar1->value + 8));
          ppLVar3 = &pLVar1->next;
        }
      }
      else {
        cm_print_error("%s: ",*result);
        check_for_leftover_values(head,error_message,1);
      }
      local_40 = local_40 + 1;
    }
  }
  return local_40;
}

Assistant:

static size_t check_for_leftover_values(
        const ListNode * const map_head, const char * const error_message,
        const size_t number_of_symbol_names) {
    const ListNode *current;
    size_t symbols_with_leftover_values = 0;
    assert_non_null(map_head);
    assert_true(number_of_symbol_names);

    for (current = map_head->next; current != map_head;
         current = current->next) {
        const SymbolMapValue * const value =
            (SymbolMapValue*)current->value;
        const ListNode *child_list;
        assert_non_null(value);
        child_list = &value->symbol_values_list_head;

        if (!list_empty(child_list)) {
            if (number_of_symbol_names == 1) {
                const ListNode *child_node;
                cm_print_error(error_message, "%s", value->symbol_name);

                for (child_node = child_list->next; child_node != child_list;
                     child_node = child_node->next) {
                    const SourceLocation * const location =
                        (const SourceLocation*)child_node->value;
                    cm_print_error(SOURCE_LOCATION_FORMAT
                                   ": note: remaining item was declared here\n",
                                   location->file, location->line);
                }
            } else {
                cm_print_error("%s: ", value->symbol_name);
                check_for_leftover_values(child_list, error_message,
                                          number_of_symbol_names - 1);
            }
            symbols_with_leftover_values ++;
        }
    }
    return symbols_with_leftover_values;
}